

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O2

char * TEST_triple_parse_unknown(void)

{
  int iVar1;
  char **ppcVar2;
  char *pcVar3;
  ulong uVar4;
  cargo_t cargo;
  char *s;
  size_t unknown_count;
  float c;
  int b;
  int a;
  char *args2 [1];
  char *args3 [2];
  char *args [3];
  
  iVar1 = cargo_init(&cargo,0,"program");
  if (iVar1 == 0) {
    args[2] = "123";
    args[0] = "program";
    args[1] = "--unknown1";
    args2[0] = "program";
    unknown_count = 0;
    args3[0] = "program";
    args3[1] = "--unknown2";
    a = 0;
    b = 0;
    c = 7.0;
    s = strdup("abc");
    if (s == (char *)0x0) {
      pcVar3 = "Failed to allocate";
    }
    else {
      cargo_add_option(cargo,0,"--alpha -a","an option","i",&a);
      cargo_add_option(cargo,0,"--beta -b","another option","i",&b);
      cargo_add_option(cargo,0,"--centauri -c","another option","f",&c);
      cargo_add_option(cargo,0,"--delta -d","another option","s",&s);
      iVar1 = cargo_parse(cargo,CARGO_SKIP_CHECK_UNKNOWN,1,3,args);
      if (iVar1 == 0) {
        pcVar3 = "Expected s to be \'abc\'";
        if ((s != (char *)0x0) && (iVar1 = strcmp(s,"abc"), iVar1 == 0)) {
          iVar1 = cargo_parse(cargo,CARGO_SKIP_CHECK_UNKNOWN,1,1,args2);
          if (iVar1 == 0) {
            if ((s != (char *)0x0) && (iVar1 = strcmp(s,"abc"), iVar1 == 0)) {
              iVar1 = cargo_parse(cargo,0,1,2,args3);
              if (iVar1 < 0) {
                ppcVar2 = cargo_get_unknown(cargo,&unknown_count);
                if (ppcVar2 == (char **)0x0) {
                  pcVar3 = "Got NULL unknown options";
                }
                else {
                  printf("Unknown option count = %lu\n",unknown_count);
                  puts("Check that \"unknown_opts\" has 1 elements");
                  if (unknown_count == 1) {
                    pcVar3 = "Array contains unexpected value";
                    uVar4 = 0;
                    do {
                      if (unknown_count <= uVar4) {
                        pcVar3 = (char *)0x0;
                        break;
                      }
                      printf("  %lu: \"%s\" -> \"%s\"\n",uVar4 + 1,ppcVar2[uVar4],"--unknown2");
                      iVar1 = strcmp(ppcVar2[uVar4],"--unknown2");
                      uVar4 = uVar4 + 1;
                    } while (iVar1 == 0);
                  }
                  else {
                    pcVar3 = "unknown_opts array count unknown_count is not expected 1";
                  }
                }
              }
              else {
                pcVar3 = "Parse did not fail 3";
              }
            }
          }
          else {
            pcVar3 = "Parse failed 2";
          }
        }
      }
      else {
        pcVar3 = "Parse failed 1";
      }
    }
    _cargo_xfree(&s);
    cargo_destroy(&cargo);
  }
  else {
    pcVar3 = "Failed to init cargo";
  }
  return pcVar3;
}

Assistant:

_TEST_START(TEST_triple_parse_unknown)
{
    //
    // Specify two unknowns in different parses, but don't check for the first.
    //
    char *args[] = { "program", "--unknown1", "123" };
    char *args2[] = { "program" };
    char *args3[] = { "program", "--unknown2" };
    char *unknown_opts_expect[] = { "--unknown2" };
    size_t unknown_count = 0;
    const char **unknown_opts = NULL;
    int a = 0;
    int b = 0;
    float c = 7.0f;
    char *s = strdup("abc");
    cargo_assert(s, "Failed to allocate");

    ret |= cargo_add_option(cargo, 0, "--alpha -a", "an option", "i", &a);
    ret |= cargo_add_option(cargo, 0, "--beta -b", "another option", "i", &b);
    ret |= cargo_add_option(cargo, 0, "--centauri -c", "another option", "f", &c);
    ret |= cargo_add_option(cargo, 0, "--delta -d", "another option", "s", &s);

    ret = cargo_parse(cargo, CARGO_SKIP_CHECK_UNKNOWN, 1, sizeof(args) / sizeof(args[0]), args);
    cargo_assert(ret == 0, "Parse failed 1");
    cargo_assert(s && !strcmp(s, "abc"), "Expected s to be 'abc'");

    ret = cargo_parse(cargo, CARGO_SKIP_CHECK_UNKNOWN, 1, sizeof(args2) / sizeof(args2[0]), args2);
    cargo_assert(ret == 0, "Parse failed 2");
    cargo_assert(s && !strcmp(s, "abc"), "Expected s to be 'abc'");

    ret = cargo_parse(cargo, 0, 1, sizeof(args3) / sizeof(args3[0]), args3);
    cargo_assert(ret < 0, "Parse did not fail 3");

    // Get unknown options.
    unknown_opts = cargo_get_unknown(cargo, &unknown_count);
    cargo_assert(unknown_opts != NULL, "Got NULL unknown options");

    printf("Unknown option count = %lu\n", unknown_count);
    cargo_assert_str_array(unknown_count, 1, unknown_opts, unknown_opts_expect);


    _TEST_CLEANUP();
    _cargo_xfree(&s);
}